

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O3

bool __thiscall pgn::find_move<(Piece)3>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  U64 UVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  U8 *pUVar10;
  Square *s;
  Move *m_00;
  long lVar11;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  if (*local_3a8.rooks != no_square) {
    s = local_3a8.rooks;
    do {
      UVar6 = magics::attacks<(Piece)3>(&local_3a8.all_pieces,s);
      uVar8 = local_3a8.qtarget & UVar6;
      if (uVar8 != 0) {
        SVar4 = *s;
        uVar9 = (ulong)local_3a8.last;
        pUVar10 = &local_3a8.list[uVar9].type;
        do {
          lVar11 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          ((Move *)(pUVar10 + -2))->f = (char)SVar4;
          pUVar10[-1] = (U8)lVar11;
          *pUVar10 = '\n';
          pUVar10 = pUVar10 + 3;
          local_3a8.last = (int)uVar9 + 1;
          uVar9 = (ulong)(uint)local_3a8.last;
          uVar8 = uVar8 & uVar8 - 1;
        } while (uVar8 != 0);
      }
      uVar8 = UVar6 & local_3a8.ctarget;
      if (uVar8 != 0) {
        SVar4 = *s;
        uVar9 = (ulong)local_3a8.last;
        pUVar10 = &local_3a8.list[uVar9].type;
        do {
          lVar11 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          ((Move *)(pUVar10 + -2))->f = (char)SVar4;
          pUVar10[-1] = (U8)lVar11;
          *pUVar10 = '\v';
          pUVar10 = pUVar10 + 3;
          local_3a8.last = (int)uVar9 + 1;
          uVar9 = (ulong)(uint)local_3a8.last;
          uVar8 = uVar8 & uVar8 - 1;
        } while (uVar8 != 0);
      }
      pSVar1 = s + 1;
      s = s + 1;
    } while (*pSVar1 != no_square);
  }
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar11 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar7 = m_00->f, (uint)(bVar7 >> 3) != row)) &&
               ((col < 0 || (bVar7 = m_00->f, (bVar7 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e4af;
              m->f = m_00->f;
            }
            else {
              m->f = bVar7;
            }
            m->t = bVar3;
            m->type = m_00->type;
LAB_0011e517:
            bVar5 = true;
            goto LAB_0011e4c6;
          }
        }
        else if ((m->type == m_00->type) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
          if (((row < 0) || (bVar7 = m_00->f, (uint)(bVar7 >> 3) != row)) &&
             ((col < 0 || (bVar7 = m_00->f, (bVar7 & 7) != col)))) {
            if (-1 < (col & row)) goto LAB_0011e4af;
            m->f = m_00->f;
          }
          else {
            m->f = bVar7;
          }
          m->t = bVar3;
          goto LAB_0011e517;
        }
      }
LAB_0011e4af:
      lVar11 = lVar11 + 1;
      m_00 = m_00 + 1;
    } while (lVar11 < local_3a8.last);
  }
  bVar5 = false;
LAB_0011e4c6:
  Movegen::~Movegen(&local_3a8);
  return bVar5;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}